

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack11_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  uVar2 = (in[1] - base) * 0x800 | uVar1 - base;
  *out = uVar2;
  *out = (in[2] - base) * 0x400000 | uVar2;
  uVar2 = in[2] - base >> 10;
  out[1] = uVar2;
  uVar2 = (in[3] - base) * 2 | uVar2;
  out[1] = uVar2;
  uVar2 = (in[4] - base) * 0x1000 | uVar2;
  out[1] = uVar2;
  out[1] = (in[5] - base) * 0x800000 | uVar2;
  uVar2 = in[5] - base >> 9;
  out[2] = uVar2;
  uVar2 = (in[6] - base) * 4 | uVar2;
  out[2] = uVar2;
  out[2] = (in[7] - base) * 0x2000 | uVar2;
  return out + 3;
}

Assistant:

uint32_t * pack11_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 11  -  1 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 11  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;

    return out + 1;
}